

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

int lodepng_color_mode_equal(LodePNGColorMode *a,LodePNGColorMode *b)

{
  long local_28;
  size_t i;
  LodePNGColorMode *b_local;
  LodePNGColorMode *a_local;
  
  if (a->colortype == b->colortype) {
    if (a->bitdepth == b->bitdepth) {
      if (a->key_defined == b->key_defined) {
        if (a->key_defined != 0) {
          if (a->key_r != b->key_r) {
            return 0;
          }
          if (a->key_g != b->key_g) {
            return 0;
          }
          if (a->key_b != b->key_b) {
            return 0;
          }
        }
        if (a->palettesize == b->palettesize) {
          for (local_28 = 0; local_28 != a->palettesize << 2; local_28 = local_28 + 1) {
            if (a->palette[local_28] != b->palette[local_28]) {
              return 0;
            }
          }
          a_local._4_4_ = 1;
        }
        else {
          a_local._4_4_ = 0;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int lodepng_color_mode_equal(const LodePNGColorMode* a, const LodePNGColorMode* b)
{
  size_t i;
  if(a->colortype != b->colortype) return 0;
  if(a->bitdepth != b->bitdepth) return 0;
  if(a->key_defined != b->key_defined) return 0;
  if(a->key_defined)
  {
    if(a->key_r != b->key_r) return 0;
    if(a->key_g != b->key_g) return 0;
    if(a->key_b != b->key_b) return 0;
  }
  /*if one of the palette sizes is 0, then we consider it to be the same as the
  other: it means that e.g. the palette was not given by the user and should be
  considered the same as the palette inside the PNG.*/
  if(1/*a->palettesize != 0 && b->palettesize != 0*/) {
    if(a->palettesize != b->palettesize) return 0;
    for(i = 0; i != a->palettesize * 4; ++i)
    {
      if(a->palette[i] != b->palette[i]) return 0;
    }
  }
  return 1;
}